

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv__dup2_cloexec(int oldfd,int newfd)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int err;
  int r;
  int newfd_local;
  int oldfd_local;
  
  if (uv__dup2_cloexec::no_dup3 == 0) {
    do {
      iVar1 = uv__dup3(oldfd,newfd,0x80000);
      bVar3 = false;
      if (iVar1 == -1) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 0x10;
      }
    } while (bVar3);
    if (iVar1 != -1) {
      return iVar1;
    }
    piVar2 = __errno_location();
    if (*piVar2 != 0x26) {
      piVar2 = __errno_location();
      return -*piVar2;
    }
    uv__dup2_cloexec::no_dup3 = 1;
  }
  do {
    newfd_local = dup2(oldfd,newfd);
    bVar3 = false;
    if (newfd_local == -1) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 0x10;
    }
  } while (bVar3);
  if (newfd_local == -1) {
    piVar2 = __errno_location();
    newfd_local = -*piVar2;
  }
  else {
    iVar1 = uv__cloexec_ioctl(newfd,1);
    if (iVar1 != 0) {
      uv__close(newfd);
      newfd_local = iVar1;
    }
  }
  return newfd_local;
}

Assistant:

int uv__dup2_cloexec(int oldfd, int newfd) {
  int r;
#if defined(__FreeBSD__) && __FreeBSD__ >= 10
  r = dup3(oldfd, newfd, O_CLOEXEC);
  if (r == -1)
    return -errno;
  return r;
#elif defined(__FreeBSD__) && defined(F_DUP2FD_CLOEXEC)
  r = fcntl(oldfd, F_DUP2FD_CLOEXEC, newfd);
  if (r != -1)
    return r;
  if (errno != EINVAL)
    return -errno;
  /* Fall through. */
#elif defined(__linux__)
  static int no_dup3;
  if (!no_dup3) {
    do
      r = uv__dup3(oldfd, newfd, UV__O_CLOEXEC);
    while (r == -1 && errno == EBUSY);
    if (r != -1)
      return r;
    if (errno != ENOSYS)
      return -errno;
    /* Fall through. */
    no_dup3 = 1;
  }
#endif
  {
    int err;
    do
      r = dup2(oldfd, newfd);
#if defined(__linux__)
    while (r == -1 && errno == EBUSY);
#else
    while (0);  /* Never retry. */
#endif

    if (r == -1)
      return -errno;

    err = uv__cloexec(newfd, 1);
    if (err) {
      uv__close(newfd);
      return err;
    }

    return r;
  }
}